

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chr.cpp
# Opt level: O1

void combine_chr(double *p_value_g,int m,int num_chr,int *m_chr,double **NM)

{
  double *pdVar1;
  double *pdVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  int iVar20;
  undefined1 auVar21 [16];
  int local_48;
  int iStack_44;
  
  lVar16 = (long)num_chr;
  uVar14 = lVar16 * 8 + 8;
  if (num_chr < -1) {
    uVar14 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar14);
  if (-1 < num_chr) {
    uVar7 = m + 1;
    uVar14 = (long)(int)uVar7 << 3;
    if (m < -1) {
      uVar14 = 0xffffffffffffffff;
    }
    lVar15 = (ulong)uVar7 - 1;
    auVar21._8_4_ = (int)lVar15;
    auVar21._0_8_ = lVar15;
    auVar21._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar11 = 0;
    auVar21 = auVar21 ^ _DAT_0010a030;
    do {
      pvVar9 = operator_new__(uVar14);
      auVar6 = _DAT_0010a030;
      local_48 = auVar21._0_4_;
      iStack_44 = auVar21._4_4_;
      *(void **)((long)pvVar8 + uVar11 * 8) = pvVar9;
      if (-1 < m) {
        uVar10 = 0;
        auVar19 = _DAT_0010a020;
        do {
          bVar4 = local_48 < SUB164(auVar19 ^ auVar6,0);
          iVar20 = SUB164(auVar19 ^ auVar6,4);
          if ((bool)(~(iStack_44 < iVar20 || iVar20 == iStack_44 && bVar4) & 1)) {
            *(undefined8 *)((long)pvVar9 + uVar10) = 0xbff0000000000000;
          }
          if (iStack_44 >= iVar20 && (iVar20 != iStack_44 || !bVar4)) {
            *(undefined8 *)((long)pvVar9 + uVar10 + 8) = 0xbff0000000000000;
          }
          lVar15 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 2;
          auVar19._8_8_ = lVar15 + 2;
          uVar10 = uVar10 + 0x10;
        } while (((ulong)uVar7 * 8 + 8 & 0xfffffffffffffff0) != uVar10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != num_chr + 1);
  }
  if (0 < num_chr) {
    uVar14 = 1;
    do {
      if (-1 < m) {
        lVar15 = 0;
        uVar11 = 0;
        do {
          if (uVar11 == 0) {
            pdVar1 = *(double **)((long)pvVar8 + uVar14 * 8);
            *pdVar1 = 0.0;
            dVar17 = 0.0;
            uVar10 = 0;
            bVar4 = false;
            do {
              pdVar2 = NM[uVar10 + 1];
              dVar17 = dVar17 + *pdVar2;
              *pdVar1 = dVar17;
              dVar18 = *pdVar2;
              bVar5 = true;
              if (dVar18 != -1.0) {
                bVar5 = bVar4;
              }
              if (NAN(dVar18)) {
                bVar5 = bVar4;
              }
              uVar10 = uVar10 + 1;
              bVar4 = bVar5;
            } while (uVar14 != uVar10);
            if (bVar5) {
              *pdVar1 = -1.0;
            }
          }
          else if (uVar14 == 1) {
            *(double *)(*(long *)((long)pvVar8 + 8) + uVar11 * 8) = NM[1][uVar11];
          }
          else if (-1 < m_chr[uVar14]) {
            lVar13 = -1;
            lVar12 = lVar15;
            do {
              dVar17 = NM[uVar14][lVar13 + 1];
              if ((dVar17 != -1.0) || (NAN(dVar17))) {
                dVar18 = *(double *)(*(long *)((long)pvVar8 + uVar14 * 8 + -8) + lVar12);
                if ((dVar18 == -1.0) && (!NAN(dVar18))) goto LAB_00105703;
                dVar17 = dVar17 + dVar18;
              }
              else {
LAB_00105703:
                dVar17 = -1.0;
              }
              dVar17 = logsum(*(double *)(*(long *)((long)pvVar8 + uVar14 * 8) + uVar11 * 8),dVar17)
              ;
              *(double *)(*(long *)((long)pvVar8 + uVar14 * 8) + uVar11 * 8) = dVar17;
              iVar20 = m_chr[uVar14];
              if ((int)uVar11 <= m_chr[uVar14]) {
                iVar20 = (int)uVar11;
              }
              lVar13 = lVar13 + 1;
              lVar12 = lVar12 + -8;
            } while (lVar13 < iVar20);
          }
          uVar11 = uVar11 + 1;
          lVar15 = lVar15 + 8;
        } while (uVar11 != m + 1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != num_chr + 1);
  }
  if (m < 0) {
    dVar17 = -1.0;
  }
  else {
    dVar17 = -1.0;
    uVar14 = 0;
    do {
      dVar17 = logsum(dVar17,*(double *)(*(long *)((long)pvVar8 + lVar16 * 8) + uVar14 * 8));
      uVar14 = uVar14 + 1;
    } while (m + 1 != uVar14);
  }
  uVar14 = 0xffffffffffffffff;
  if (-2 < m) {
    uVar14 = (long)m * 8 + 8;
  }
  pvVar9 = operator_new__(uVar14);
  if (-1 < m) {
    uVar14 = (ulong)(uint)m;
    lVar15 = uVar14 * 8 + 8;
    lVar12 = 0;
    do {
      lVar13 = lVar12 + -1;
      if (lVar12 == 0) {
        *(undefined8 *)((long)pvVar9 + uVar14 * 8) =
             *(undefined8 *)(*(long *)((long)pvVar8 + lVar16 * 8) + uVar14 * 8);
      }
      else {
        dVar18 = logsum(*(double *)((long)pvVar9 + lVar12 * 8 + lVar15),
                        *(double *)(*(long *)((long)pvVar8 + lVar16 * 8) + uVar14 * 8 + lVar12 * 8))
        ;
        *(double *)((long)pvVar9 + lVar13 * 8 + lVar15) = dVar18;
      }
      lVar12 = lVar13;
    } while (-lVar13 != (ulong)(m + 1));
  }
  if (-1 < m) {
    uVar14 = 0;
    do {
      dVar18 = exp(*(double *)((long)pvVar9 + uVar14 * 8) - dVar17);
      p_value_g[uVar14] = dVar18;
      uVar14 = uVar14 + 1;
    } while (m + 1 != uVar14);
  }
  if (-1 < num_chr) {
    uVar14 = 0;
    do {
      pvVar3 = *(void **)((long)pvVar8 + uVar14 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
      uVar14 = uVar14 + 1;
    } while (num_chr + 1 != uVar14);
  }
  operator_delete__(pvVar8);
  operator_delete__(pvVar9);
  return;
}

Assistant:

void combine_chr(double* p_value_g, int m, int num_chr, int* m_chr, double** NM)
{
    double** M;
    M = new double* [num_chr+1];
    for(int q=0; q<=num_chr; q++)
    {
        M[q] = new double [m+1];
        for(int k=0; k<=m; k++)
            M[q][k] = -1;
    }
    for(int q=1; q<=num_chr; q++)
    {
        for(int k=0; k<=m; k++)
        {
            if (k==0)
            {
                M[q][0] = 0;
                int flag = 0;
                for(int j=1; j<=q; j++){
                    M[q][0] += NM[j][0];
                    if (NM[j][0]==-1)
                        flag = 1;
                }
                if (flag==1)
                    M[q][0] = -1;
            }
            else if (q==1)
                M[1][k] = NM[1][k]; //could lower max_m_chr by taking care of this
            else
            {
                double temp = -1;
                for(int i=0; i<=min(k,m_chr[q]); i++)
                {
                    temp = M[q-1][k-i]+NM[q][i];
                    if (NM[q][i]==-1 || M[q-1][k-i]==-1)
                        temp = -1;
                    M[q][k] = logsum(M[q][k], temp);
                }
            }
        }
    }

    double Sum1 = -1;
    for(int k=0; k<=m; k++) {
        Sum1 = logsum(Sum1, M[num_chr][k]);
    }

    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++) {
        if (k==0) {
            CumSum[m] = M[num_chr][m];
        }
        else CumSum[m-k] = logsum(CumSum[m-k+1], M[num_chr][m-k]);
    }

    for(int k=0; k<=m; k++) {
        p_value_g[k] = exp(CumSum[k] - Sum1);
    }

    for(int i=0; i<=num_chr; i++)
    {
        delete [] M[i];
    }
    delete [] M;
    delete [] CumSum;
    return;
}